

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_FooBar_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  char *pcVar1;
  void *local_b0;
  void *base_4;
  size_t count_3;
  char *base_3;
  void *pvStack_90;
  float val_2;
  float *base_2;
  size_t count_2;
  void *pvStack_78;
  int32_t val_1;
  int32_t *base_1;
  size_t count_1;
  void *pvStack_60;
  int8_t val;
  int8_t *base;
  size_t count;
  uint64_t w;
  char *mark;
  void *pval;
  flatcc_builder_ref_t ref;
  int more;
  void *struct_base_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  _ref = struct_base;
  struct_base_local = end;
  end_local = buf;
  buf_local = (char *)ctx;
  end_local = flatcc_json_parser_object_start(ctx,buf,end,(int *)((long)&pval + 4));
  do {
    if (pval._4_4_ == 0) {
      return end_local;
    }
    end_local = flatcc_json_parser_symbol_start
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local);
    count = flatcc_json_parser_symbol_part(end_local,(char *)struct_base_local);
    if (count < 0x666f6f0000000000) {
      if ((count & 0xffffff0000000000) == 0x636f6c0000000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,3);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local);
        }
        else {
          base = (int8_t *)0x3;
          pvStack_60 = (void *)((long)_ref + 0x68);
          end_local = flatcc_json_parser_array_start
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local,(int *)((long)&pval + 4));
          while (pval._4_4_ != 0) {
            count_1._7_1_ = '\0';
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_int8
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,(int8_t *)((long)&count_1 + 7));
            if (((char *)w == end_local) &&
               ((w = (uint64_t)end_local,
                end_local = flatcc_json_parser_symbolic_int8
                                      ((flatcc_json_parser_t *)buf_local,end_local,
                                       (char *)struct_base_local,
                                       MyGame_Example_FooBar_parse_json_struct_inline::
                                       symbolic_parsers,(int8_t *)((long)&count_1 + 7)),
                end_local == (char *)w || (end_local == (char *)struct_base_local)))) {
LAB_00114dc7:
              pcVar1 = flatcc_json_parser_set_error
                                 ((flatcc_json_parser_t *)buf_local,end_local,
                                  (char *)struct_base_local,0x23);
              return pcVar1;
            }
            if (base == (int8_t *)0x0) {
              if ((*(uint *)(buf_local + 0x10) & 8) == 0) {
                pcVar1 = flatcc_json_parser_set_error
                                   ((flatcc_json_parser_t *)buf_local,end_local,
                                    (char *)struct_base_local,0x22);
                return pcVar1;
              }
            }
            else {
              flatbuffers_int8_write_to_pe(pvStack_60,count_1._7_1_);
              base = base + -1;
              pvStack_60 = (void *)((long)pvStack_60 + 1);
            }
            end_local = flatcc_json_parser_array_end
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,(int *)((long)&pval + 4));
          }
          if (base != (int8_t *)0x0) {
            if ((*(uint *)(buf_local + 0x10) & 0x10) != 0) {
              pcVar1 = flatcc_json_parser_set_error
                                 ((flatcc_json_parser_t *)buf_local,end_local,
                                  (char *)struct_base_local,0x21);
              return pcVar1;
            }
            memset(pvStack_60,0,(size_t)base);
          }
        }
      }
      else if ((count & 0xffffff0000000000) == 0x6261720000000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,3);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local);
        }
        else {
          base_1 = (int32_t *)0xa;
          pvStack_78 = (void *)((long)_ref + 0x40);
          end_local = flatcc_json_parser_array_start
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local,(int *)((long)&pval + 4));
          while (pval._4_4_ != 0) {
            count_2._4_4_ = 0;
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_int32
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,(int32_t *)((long)&count_2 + 4));
            if (((char *)w == end_local) &&
               ((w = (uint64_t)end_local,
                end_local = flatcc_json_parser_symbolic_int32
                                      ((flatcc_json_parser_t *)buf_local,end_local,
                                       (char *)struct_base_local,
                                       MyGame_Example_FooBar_parse_json_struct_inline::
                                       symbolic_parsers_1,(int32_t *)((long)&count_2 + 4)),
                end_local == (char *)w || (end_local == (char *)struct_base_local))))
            goto LAB_00114dc7;
            if (base_1 == (int32_t *)0x0) {
              if ((*(uint *)(buf_local + 0x10) & 8) == 0) {
                pcVar1 = flatcc_json_parser_set_error
                                   ((flatcc_json_parser_t *)buf_local,end_local,
                                    (char *)struct_base_local,0x22);
                return pcVar1;
              }
            }
            else {
              flatbuffers_int32_write_to_pe(pvStack_78,count_2._4_4_);
              base_1 = (int32_t *)((long)base_1 + -1);
              pvStack_78 = (void *)((long)pvStack_78 + 4);
            }
            end_local = flatcc_json_parser_array_end
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,(int *)((long)&pval + 4));
          }
          if (base_1 != (int32_t *)0x0) {
            if ((*(uint *)(buf_local + 0x10) & 0x10) != 0) {
              pcVar1 = flatcc_json_parser_set_error
                                 ((flatcc_json_parser_t *)buf_local,end_local,
                                  (char *)struct_base_local,0x21);
              return pcVar1;
            }
            memset(pvStack_78,0,(long)base_1 << 2);
          }
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
    }
    else if (count < 0x7465737473000000) {
      if ((count & 0xffffff0000000000) == 0x666f6f0000000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,3);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local);
        }
        else {
          base_2 = (float *)0x10;
          pvStack_90 = _ref;
          end_local = flatcc_json_parser_array_start
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local,(int *)((long)&pval + 4));
          while (pval._4_4_ != 0) {
            base_3._4_4_ = 0.0;
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_float
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,(float *)((long)&base_3 + 4));
            if (((char *)w == end_local) &&
               ((w = (uint64_t)end_local,
                end_local = flatcc_json_parser_symbolic_float
                                      ((flatcc_json_parser_t *)buf_local,end_local,
                                       (char *)struct_base_local,
                                       MyGame_Example_FooBar_parse_json_struct_inline::
                                       symbolic_parsers_2,(float *)((long)&base_3 + 4)),
                end_local == (char *)w || (end_local == (char *)struct_base_local))))
            goto LAB_00114dc7;
            if (base_2 == (float *)0x0) {
              if ((*(uint *)(buf_local + 0x10) & 8) == 0) {
                pcVar1 = flatcc_json_parser_set_error
                                   ((flatcc_json_parser_t *)buf_local,end_local,
                                    (char *)struct_base_local,0x22);
                return pcVar1;
              }
            }
            else {
              flatbuffers_float_write_to_pe(pvStack_90,base_3._4_4_);
              base_2 = (float *)((long)base_2 + -1);
              pvStack_90 = (void *)((long)pvStack_90 + 4);
            }
            end_local = flatcc_json_parser_array_end
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,(int *)((long)&pval + 4));
          }
          if (base_2 != (float *)0x0) {
            if ((*(uint *)(buf_local + 0x10) & 0x10) != 0) {
              pcVar1 = flatcc_json_parser_set_error
                                 ((flatcc_json_parser_t *)buf_local,end_local,
                                  (char *)struct_base_local,0x21);
              return pcVar1;
            }
            memset(pvStack_90,0,(long)base_2 << 2);
          }
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
    }
    else if ((count & 0xffffffff00000000) == 0x7465787400000000) {
      w = (uint64_t)end_local;
      end_local = flatcc_json_parser_match_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,4
                            );
      if ((char *)w == end_local) {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
      else {
        end_local = flatcc_json_parser_char_array
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,(char *)((long)_ref + 0x74),5);
      }
    }
    else if ((count & 0xffffffffff000000) == 0x7465737473000000) {
      w = (uint64_t)end_local;
      end_local = flatcc_json_parser_match_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,5
                            );
      if ((char *)w == end_local) {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
      else {
        base_4 = (void *)0x2;
        local_b0 = (void *)((long)_ref + 0x6c);
        end_local = flatcc_json_parser_array_start
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,(int *)((long)&pval + 4));
        while (pval._4_4_ != 0) {
          if (base_4 == (void *)0x0) {
            if ((*(uint *)(buf_local + 0x10) & 8) == 0) {
              pcVar1 = flatcc_json_parser_set_error
                                 ((flatcc_json_parser_t *)buf_local,end_local,
                                  (char *)struct_base_local,0x22);
              return pcVar1;
            }
          }
          else {
            end_local = MyGame_Example_Test_parse_json_struct_inline
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,local_b0);
            base_4 = (void *)((long)base_4 + -1);
            local_b0 = (void *)((long)local_b0 + 4);
          }
          end_local = flatcc_json_parser_array_end
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local,(int *)((long)&pval + 4));
        }
        if (base_4 != (void *)0x0) {
          if ((*(uint *)(buf_local + 0x10) & 0x10) != 0) {
            pcVar1 = flatcc_json_parser_set_error
                               ((flatcc_json_parser_t *)buf_local,end_local,
                                (char *)struct_base_local,0x21);
            return pcVar1;
          }
          memset(local_b0,0,(long)base_4 << 2);
        }
      }
    }
    else {
      end_local = flatcc_json_parser_unmatched_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local);
    }
    end_local = flatcc_json_parser_object_end
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,
                           (int *)((long)&pval + 4));
  } while( true );
}

Assistant:

static const char *MyGame_Example_FooBar_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x666f6f0000000000) { /* branch "foo" */
            if ((w & 0xffffff0000000000) == 0x636f6c0000000000) { /* "col" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                if (mark != buf) {
                    size_t count = 3;
                    int8_t *base = (int8_t *)((size_t)struct_base + 104);
                    buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                    while (more) {
                        int8_t val = 0;
                        static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                MyGame_Example_Color_parse_json_enum,
                                monster_test_local_MyGame_Example_json_parser_enum,
                                monster_test_global_json_parser_enum, 0 };
                        buf = flatcc_json_parser_int8(ctx, (mark = buf), end, &val);
                        if (mark == buf) {
                            buf = flatcc_json_parser_symbolic_int8(ctx, (mark = buf), end, symbolic_parsers, &val);
                            if (buf == mark || buf == end) goto failed;
                        }
                        if (count) {
                            flatbuffers_int8_write_to_pe(base, val);
                            --count;
                            ++base;
                        } else if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {
                            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);
                        }
                        buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                    }
                    if (count) {
                        if (ctx->flags & flatcc_json_parser_f_reject_array_underflow) {
                            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_underflow);
                        }
                        memset(base, 0, count * sizeof(*base));
                    }
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "col" */
                if ((w & 0xffffff0000000000) == 0x6261720000000000) { /* "bar" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                    if (mark != buf) {
                        size_t count = 10;
                        int32_t *base = (int32_t *)((size_t)struct_base + 64);
                        buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                        while (more) {
                            int32_t val = 0;
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_int32(ctx, (mark = buf), end, &val);
                            if (mark == buf) {
                                buf = flatcc_json_parser_symbolic_int32(ctx, (mark = buf), end, symbolic_parsers, &val);
                                if (buf == mark || buf == end) goto failed;
                            }
                            if (count) {
                                flatbuffers_int32_write_to_pe(base, val);
                                --count;
                                ++base;
                            } else if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {
                                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);
                            }
                            buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                        }
                        if (count) {
                            if (ctx->flags & flatcc_json_parser_f_reject_array_underflow) {
                                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_underflow);
                            }
                            memset(base, 0, count * sizeof(*base));
                        }
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "bar" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "bar" */
            } /* "col" */
        } else { /* branch "foo" */
            if (w < 0x7465737473000000) { /* branch "tests" */
                if ((w & 0xffffff0000000000) == 0x666f6f0000000000) { /* "foo" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                    if (mark != buf) {
                        size_t count = 16;
                        float *base = (float *)((size_t)struct_base + 0);
                        buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                        while (more) {
                            float val = 0;
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                            if (mark == buf) {
                                buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                if (buf == mark || buf == end) goto failed;
                            }
                            if (count) {
                                flatbuffers_float_write_to_pe(base, val);
                                --count;
                                ++base;
                            } else if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {
                                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);
                            }
                            buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                        }
                        if (count) {
                            if (ctx->flags & flatcc_json_parser_f_reject_array_underflow) {
                                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_underflow);
                            }
                            memset(base, 0, count * sizeof(*base));
                        }
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "foo" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "foo" */
            } else { /* branch "tests" */
                if ((w & 0xffffffff00000000) == 0x7465787400000000) { /* "text" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 4);
                    if (mark != buf) {
                        char *base = (char *)((size_t)struct_base + 116);
                        buf = flatcc_json_parser_char_array(ctx, buf, end, base, 5);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "text" */
                    if ((w & 0xffffffffff000000) == 0x7465737473000000) { /* "tests" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                        if (mark != buf) {
                            size_t count = 2;
                            void *base = (void *)((size_t)struct_base + 108);
                            buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                            while (more) {
                                if (count) {
                                    buf = MyGame_Example_Test_parse_json_struct_inline(ctx, buf, end, base);
                                    --count;
                                    base = (void *)((size_t)base + 4);
                                } else if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {
                                    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);
                                }
                                buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                            }
                            if (count) {
                                if (ctx->flags & flatcc_json_parser_f_reject_array_underflow) {
                                    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_underflow);
                                }
                                memset(base, 0, count * 4);
                            }
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "tests" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "tests" */
                } /* "text" */
            } /* branch "tests" */
        } /* branch "foo" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}